

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> * __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
operator=(ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
          *this,ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
                *param_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((((this->value).ptr.isSet == true) &&
        ((this->value).ptr.isSet = false, (this->value).ptr.field_1.value.ptr.isSet == true)) &&
       (lVar1 = *(long *)((long)&(this->value).ptr.field_1 + 8), lVar1 != 0)) {
      uVar2 = *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x10);
      *(undefined8 *)((long)&(this->value).ptr.field_1 + 8) = 0;
      *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x10) = 0;
      puVar3 = *(undefined8 **)((long)&(this->value).ptr.field_1 + 0x18);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    if ((param_1->value).ptr.isSet == true) {
      Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
                (&(this->value).ptr.field_1.value,&(param_1->value).ptr.field_1.value);
      (this->value).ptr.isSet = true;
    }
  }
  if ((((param_1->value).ptr.isSet == true) &&
      ((param_1->value).ptr.isSet = false, (param_1->value).ptr.field_1.value.ptr.isSet == true)) &&
     (lVar1 = *(long *)((long)&(param_1->value).ptr.field_1 + 8), lVar1 != 0)) {
    uVar2 = *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x10);
    *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 8) = 0;
    *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x10) = 0;
    puVar3 = *(undefined8 **)((long)&(param_1->value).ptr.field_1 + 0x18);
    (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;